

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O0

void __thiscall YAML::NodeBuilder::RegisterAnchor(NodeBuilder *this,anchor_t anchor,node *node)

{
  vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *in_RDX;
  long in_RSI;
  value_type *in_RDI;
  
  if (in_RSI != 0) {
    std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::push_back
              (in_RDX,in_RDI);
  }
  return;
}

Assistant:

void NodeBuilder::RegisterAnchor(anchor_t anchor, detail::node& node) {
  if (anchor) {
    assert(anchor == m_anchors.size());
    m_anchors.push_back(&node);
  }
}